

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::doAddRow(SPxLPBase<double> *this,LPRowBase<double> *row,bool scale)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SVectorBase<double> *this_00;
  double *pdVar5;
  int *piVar6;
  byte in_DL;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  long *in_RDI;
  Real RVar8;
  int k;
  LPColBase<double> empty;
  double val;
  int i;
  int j;
  DataArray<int> *colscaleExp;
  SVectorBase<double> *vec;
  int newRowScaleExp;
  int oldColNumber;
  int idx;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  LPRowBase<double> *in_stack_ffffffffffffff28;
  LPRowSetBase<double> *in_stack_ffffffffffffff30;
  int local_7c;
  uint local_34;
  int local_20;
  
  iVar2 = nRows((SPxLPBase<double> *)0x233204);
  iVar3 = nCols((SPxLPBase<double> *)0x233215);
  local_20 = 0;
  LPRowSetBase<double>::add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  this_00 = rowVector_w((SPxLPBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
  if (((in_DL & 1) != 0) && (in_RDI[0x35] != 0)) {
    local_20 = (**(code **)(*(long *)in_RDI[0x35] + 8))
                         ((long *)in_RDI[0x35],this_00,(DataArray<int> *)(in_RDI + 0x2f));
    pdVar5 = rhs((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
    dVar1 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (dVar1 < *pdVar5) {
      rhs_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff1c);
      RVar8 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      pdVar5 = rhs_w((SPxLPBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
      *pdVar5 = RVar8;
    }
    pdVar5 = lhs((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
    dVar1 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar1) {
      lhs_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
            in_stack_ffffffffffffff1c);
      RVar8 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      pdVar5 = lhs_w((SPxLPBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
      *pdVar5 = RVar8;
    }
    maxRowObj_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                in_stack_ffffffffffffff1c);
    RVar8 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
    pdVar5 = maxRowObj_w((SPxLPBase<double> *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff1c);
    *pdVar5 = RVar8;
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),iVar2);
    *piVar6 = local_20;
  }
  local_34 = SVectorBase<double>::size(this_00);
  uVar7 = extraout_RDX;
  while (local_34 = local_34 - 1, -1 < (int)local_34) {
    piVar6 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)local_34,(int)uVar7);
    iVar2 = *piVar6;
    if ((in_DL & 1) != 0) {
      pdVar5 = SVectorBase<double>::value(this_00,local_34);
      in_stack_ffffffffffffff28 = (LPRowBase<double> *)*pdVar5;
      in_stack_ffffffffffffff24 = local_20;
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),iVar2);
      in_stack_ffffffffffffff30 =
           (LPRowSetBase<double> *)
           spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c);
      pdVar5 = SVectorBase<double>::value(this_00,local_34);
      *pdVar5 = (double)in_stack_ffffffffffffff30;
    }
    SVectorBase<double>::value(this_00,local_34);
    in_stack_ffffffffffffff20 = iVar2;
    iVar4 = nCols((SPxLPBase<double> *)0x233512);
    if (iVar4 <= in_stack_ffffffffffffff20) {
      LPColBase<double>::LPColBase
                ((LPColBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      in_stack_ffffffffffffff1c = nCols((SPxLPBase<double> *)0x233532);
      for (local_7c = in_stack_ffffffffffffff1c; local_7c <= iVar2; local_7c = local_7c + 1) {
        LPColSetBase<double>::add
                  ((LPColSetBase<double> *)in_stack_ffffffffffffff30,
                   (LPColBase<double> *)in_stack_ffffffffffffff28);
      }
      LPColBase<double>::~LPColBase((LPColBase<double> *)0x23359b);
    }
    LPColSetBase<double>::add2
              ((LPColSetBase<double> *)in_stack_ffffffffffffff30,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28,
               (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (double *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    uVar7 = extraout_RDX_00;
  }
  (**(code **)(*in_RDI + 0x280))(in_RDI,1);
  iVar2 = nCols((SPxLPBase<double> *)0x2335fb);
  (**(code **)(*in_RDI + 0x288))(in_RDI,iVar2 - iVar3);
  return;
}

Assistant:

void doAddRow(const LPRowBase<R>& row, bool scale = false)
   {
      int idx = nRows();
      int oldColNumber = nCols();
      int newRowScaleExp = 0;

      LPRowSetBase<R>::add(row);

      SVectorBase<R>& vec = rowVector_w(idx);

      DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

      // compute new row scaling factor and apply it to the sides
      if(scale && lp_scaler)
      {
         newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

         if(rhs(idx) < R(infinity))
            rhs_w(idx) = spxLdexp(rhs_w(idx), newRowScaleExp);

         if(lhs(idx) > R(-infinity))
            lhs_w(idx) = spxLdexp(lhs_w(idx), newRowScaleExp);

         maxRowObj_w(idx) = spxLdexp(maxRowObj_w(idx), newRowScaleExp);

         LPRowSetBase<R>::scaleExp[idx] = newRowScaleExp;
      }

      // now insert nonzeros to column file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new row and existing column scaling factors to new values in RowSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[i]);

         R val = vec.value(j);

         // create new columns if required
         if(i >= nCols())
         {
            LPColBase<R> empty;

            for(int k = nCols(); k <= i; ++k)
               LPColSetBase<R>::add(empty);
         }

         assert(i < nCols());
         LPColSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedRows(1);
      addedCols(nCols() - oldColNumber);
   }